

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

uint32_t WriteBinaryScene(aiScene *scene)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint i_1;
  uint i;
  ulong uVar9;
  uint i_2;
  int iVar10;
  
  ofs = WriteMagic(0x1239);
  uVar1 = Write<unsigned_int>(&scene->mFlags);
  uVar2 = Write<unsigned_int>(&scene->mNumMeshes);
  uVar3 = Write<unsigned_int>(&scene->mNumMaterials);
  uVar4 = Write<unsigned_int>(&scene->mNumAnimations);
  uVar5 = Write<unsigned_int>(&scene->mNumTextures);
  uVar6 = Write<unsigned_int>(&scene->mNumLights);
  uVar7 = Write<unsigned_int>(&scene->mNumCameras);
  uVar8 = WriteBinaryNode(scene->mRootNode);
  iVar10 = uVar6 + uVar5 + uVar7 + uVar4 + uVar3 + uVar2 + uVar1 + uVar8;
  for (uVar9 = 0; uVar1 = iVar10 + 8, uVar9 < scene->mNumMeshes; uVar9 = uVar9 + 1) {
    uVar2 = WriteBinaryMesh(scene->mMeshes[uVar9]);
    iVar10 = uVar1 + uVar2;
  }
  for (uVar9 = 0; uVar9 < scene->mNumMaterials; uVar9 = uVar9 + 1) {
    uVar2 = WriteBinaryMaterial(scene->mMaterials[uVar9]);
    uVar1 = uVar1 + uVar2 + 8;
  }
  for (uVar9 = 0; uVar9 < scene->mNumAnimations; uVar9 = uVar9 + 1) {
    uVar2 = WriteBinaryAnim(scene->mAnimations[uVar9]);
    uVar1 = uVar1 + uVar2 + 8;
  }
  for (uVar9 = 0; uVar9 < scene->mNumTextures; uVar9 = uVar9 + 1) {
    uVar2 = WriteBinaryTexture(scene->mTextures[uVar9]);
    uVar1 = uVar1 + uVar2 + 8;
  }
  for (uVar9 = 0; uVar9 < scene->mNumLights; uVar9 = uVar9 + 1) {
    uVar2 = WriteBinaryLight(scene->mLights[uVar9]);
    uVar1 = uVar1 + uVar2 + 8;
  }
  for (uVar9 = 0; uVar9 < scene->mNumCameras; uVar9 = uVar9 + 1) {
    uVar2 = WriteBinaryCamera(scene->mCameras[uVar9]);
    uVar1 = uVar1 + uVar2 + 8;
  }
  ChangeInteger(ofs,uVar1);
  return uVar1;
}

Assistant:

uint32_t WriteBinaryScene(const aiScene* scene)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AISCENE);

	// basic scene information
	len += Write<unsigned int>(scene->mFlags);
	len += Write<unsigned int>(scene->mNumMeshes);
	len += Write<unsigned int>(scene->mNumMaterials);
	len += Write<unsigned int>(scene->mNumAnimations);
	len += Write<unsigned int>(scene->mNumTextures);
	len += Write<unsigned int>(scene->mNumLights);
	len += Write<unsigned int>(scene->mNumCameras);
	
	// write node graph
	len += WriteBinaryNode(scene->mRootNode)+8;

	// write all meshes
	for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
		const aiMesh* mesh = scene->mMeshes[i];
		len += WriteBinaryMesh(mesh)+8;
	}

	// write materials
	for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
		const aiMaterial* mat = scene->mMaterials[i];
		len += WriteBinaryMaterial(mat)+8;
	}

	// write all animations
	for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
		const aiAnimation* anim = scene->mAnimations[i];
		len += WriteBinaryAnim(anim)+8;
	}


	// write all textures
	for (unsigned int i = 0; i < scene->mNumTextures;++i) {
		const aiTexture* mesh = scene->mTextures[i];
		len += WriteBinaryTexture(mesh)+8;
	}

	// write lights
	for (unsigned int i = 0; i < scene->mNumLights;++i) {
		const aiLight* l = scene->mLights[i];
		len += WriteBinaryLight(l)+8;
	}

	// write cameras
	for (unsigned int i = 0; i < scene->mNumCameras;++i) {
		const aiCamera* cam = scene->mCameras[i];
		len += WriteBinaryCamera(cam)+8;
	}

	ChangeInteger(old,len);
	return len;
}